

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall
GlobOpt::SetLoopFieldInitialValue
          (GlobOpt *this,Loop *loop,Instr *instr,PropertySym *propertySym,
          PropertySym *originalPropertySym)

{
  ValueNumber VVar1;
  StackSym *pSVar2;
  JitArenaAllocator *pJVar3;
  Sym *pSVar4;
  code *pcVar5;
  PropertySym *pPVar6;
  BasicBlock *pBVar7;
  BOOLEAN BVar8;
  bool bVar9;
  uint sourceContextId;
  uint functionId;
  Value *pVVar10;
  undefined4 *puVar11;
  ProfiledInstr *pPVar12;
  ValueType *pVVar13;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  BasicBlock *pBVar14;
  BasicBlock *pBVar15;
  BasicBlock *block;
  BasicBlock *pBVar16;
  undefined1 local_90 [8];
  anon_class_24_3_49332160 CanSetInitialValue;
  Value *currentObjPtrVal;
  StackSym *local_68;
  StackSym *objectSym;
  Value *landingPadObjPtrVal;
  StackSym *local_50;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  PropertySym *pPStack_40;
  ValueType profiledValueType;
  PropertySym *propertySym_local;
  Value *initialValue;
  
  propertySym_local = (PropertySym *)0x0;
  if (((((loop->field_0x178 & 0x80) == 0) &&
       (pPStack_40 = propertySym,
       BVar8 = BVSparse<Memory::JitArenaAllocator>::Test
                         (loop->fieldKilled,(originalPropertySym->super_Sym).m_id), BVar8 == '\0'))
      && (BVar8 = BVSparse<Memory::JitArenaAllocator>::Test
                            (loop->fieldKilled,(propertySym->super_Sym).m_id), BVar8 == '\0')) &&
     (pVVar10 = GlobOptBlockData::FindValue
                          (&this->currentBlock->globOptData,&propertySym->super_Sym),
     pVVar10 == (Value *)0x0)) {
    bVar9 = JsUtil::
            BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetValue<PropertySym*>
                      ((BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)&loop->initialValueFieldMap,&stack0xffffffffffffffc0,
                       (Value **)&propertySym_local);
    if (bVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0xc98,
                         "(!loop->initialValueFieldMap.TryGetValue(propertySym, &initialValue))",
                         "!loop->initialValueFieldMap.TryGetValue(propertySym, &initialValue)");
      if (!bVar9) goto LAB_0044f5f5;
      *puVar11 = 0;
    }
    BVar8 = BVSparse<Memory::JitArenaAllocator>::Test
                      ((loop->landingPad->globOptData).liveFields,(pPStack_40->super_Sym).m_id);
    if (BVar8 == '\0') {
      pSVar2 = pPStack_40->m_stackSym;
      local_68 = pSVar2;
      local_50 = (StackSym *)&loop->initialValueFieldMap;
      objectSym = (StackSym *)
                  GlobOptBlockData::FindValue(&loop->landingPad->globOptData,&pSVar2->super_Sym);
      CanSetInitialValue.objectSym =
           (StackSym **)
           GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&pSVar2->super_Sym);
      local_90 = (undefined1  [8])&CanSetInitialValue.objectSym;
      CanSetInitialValue.currentObjPtrVal = (Value **)&objectSym;
      CanSetInitialValue.landingPadObjPtrVal = (Value **)&local_68;
      bVar9 = SetLoopFieldInitialValue::anon_class_24_3_49332160::operator()
                        ((anon_class_24_3_49332160 *)local_90);
      if (bVar9) {
        if (instr->m_kind == InstrKindProfiled) {
          pPVar12 = IR::Instr::AsProfiledInstr(instr);
          pVVar13 = (ValueType *)&pPVar12->u;
        }
        else {
          pVVar13 = &ValueType::Uninitialized;
        }
        pSVar2 = local_50;
        local_42 = (anon_union_2_4_ea848c7b_for_ValueType_13)pVVar13->field_0;
        bVar9 = ValueType::IsDefinite((ValueType *)&local_42.field_0);
        if (bVar9) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0xcd5,"(!profiledValueType.IsDefinite())",
                             "!profiledValueType.IsDefinite()");
          if (!bVar9) {
LAB_0044f5f5:
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar11 = 0;
        }
        propertySym_local =
             (PropertySym *)NewGenericValue(this,(ValueType)local_42.field_0,&pPStack_40->super_Sym)
        ;
        local_50 = StackSym::New(this->func);
        ValueInfo::SetSymStore
                  ((ValueInfo *)(propertySym_local->super_Sym).m_next,&local_50->super_Sym);
        currentObjPtrVal =
             ::Value::Copy((Value *)propertySym_local,this->alloc,
                           *(ValueNumber *)&(propertySym_local->super_Sym)._vptr_Sym);
        JsUtil::
        BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                  ((BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)pSVar2,&stack0xffffffffffffffc0,&currentObjPtrVal);
        pJVar3 = this->alloc;
        VVar1 = *(ValueNumber *)&(propertySym_local->super_Sym)._vptr_Sym;
        landingPadObjPtrVal =
             (Value *)ValueInfo::New(pJVar3,(ValueType)
                                            *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                             &((propertySym_local->super_Sym).m_next)->m_next);
        pVVar10 = (Value *)new<Memory::JitArenaAllocator>(0x10,pJVar3,0x3eba5c);
        pVVar10->valueNumber = VVar1;
        pVVar10->valueInfo = (ValueInfo *)landingPadObjPtrVal;
        GlobOptBlockData::SetValue(&loop->landingPad->globOptData,pVVar10,&pPStack_40->super_Sym);
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((loop->landingPad->globOptData).liveFields,(pPStack_40->super_Sym).m_id);
        this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
        this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
        bVar9 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015b6718,FieldPREPhase,sourceContextId,functionId);
        if (bVar9) {
          pBVar14 = Loop::GetHeadBlock(loop);
          Output::Print(L"** TRACE:  Field PRE initial value for loop head #%d. Val:%d symStore:",
                        (ulong)pBVar14->number,
                        (ulong)*(uint *)&(propertySym_local->super_Sym)._vptr_Sym);
          Sym::Dump(&local_50->super_Sym,(ValueType)0x9);
          Output::Print(L"\n    Instr: ");
          IR::Instr::Dump(instr);
          Output::Flush();
        }
        pBVar14 = Loop::GetHeadBlock(loop);
        if (pBVar14 == (BasicBlock *)0x0) {
          pBVar14 = (BasicBlock *)0x0;
        }
        else {
          pBVar14 = Loop::GetHeadBlock(loop);
          pBVar14 = pBVar14->prev;
        }
        pBVar15 = this->currentBlock;
        pBVar16 = pBVar15;
        do {
          pBVar16 = pBVar16->prev;
        } while ((pBVar16->field_0x18 & 1) != 0);
        pBVar7 = pBVar14;
        if (pBVar16 != pBVar14) {
          do {
            landingPadObjPtrVal = (Value *)pBVar7;
            pPVar6 = propertySym_local;
            if (((pBVar16->field_0x18 & 1) == 0) && (pBVar16->dataUseCount != 0)) {
              pJVar3 = this->alloc;
              VVar1 = *(ValueNumber *)&(propertySym_local->super_Sym)._vptr_Sym;
              ValueInfo::SetIsShared((ValueInfo *)(propertySym_local->super_Sym).m_next);
              pSVar4 = (pPVar6->super_Sym).m_next;
              pVVar10 = (Value *)new<Memory::JitArenaAllocator>(0x10,pJVar3,0x3eba5c);
              pVVar10->valueNumber = VVar1;
              pVVar10->valueInfo = (ValueInfo *)pSVar4;
              GlobOptBlockData::SetValue(&pBVar16->globOptData,pVVar10,&pPStack_40->super_Sym);
              BVSparse<Memory::JitArenaAllocator>::Set
                        ((pBVar16->globOptData).liveFields,(pPStack_40->super_Sym).m_id);
              pSVar2 = local_50;
              GlobOptBlockData::SetValue(&pBVar16->globOptData,pVVar10,&local_50->super_Sym);
              BVSparse<Memory::JitArenaAllocator>::Set
                        ((pBVar16->globOptData).liveVarSyms,(pSVar2->super_Sym).m_id);
              pBVar14 = (BasicBlock *)landingPadObjPtrVal;
            }
            pBVar16 = pBVar16->prev;
            pBVar7 = (BasicBlock *)landingPadObjPtrVal;
          } while (pBVar16 != pBVar14);
          pBVar15 = this->currentBlock;
        }
        pSVar2 = local_50;
        GlobOptBlockData::SetValue
                  (&pBVar15->globOptData,(Value *)propertySym_local,&local_50->super_Sym);
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((this->currentBlock->globOptData).liveVarSyms,(pSVar2->super_Sym).m_id);
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((this->currentBlock->globOptData).liveFields,(pPStack_40->super_Sym).m_id);
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::SetLoopFieldInitialValue(Loop *loop, IR::Instr *instr, PropertySym *propertySym, PropertySym *originalPropertySym)
{
    Value *initialValue = nullptr;
    StackSym *symStore;

    if (loop->allFieldsKilled || loop->fieldKilled->Test(originalPropertySym->m_id) || loop->fieldKilled->Test(propertySym->m_id))
    {
        return;
    }

    // Value already exists
    if (CurrentBlockData()->FindValue(propertySym))
    {
        return;
    }

    // If this initial value was already added, we would find in the current value table.
    Assert(!loop->initialValueFieldMap.TryGetValue(propertySym, &initialValue));

    // If propertySym is live in landingPad, we don't need an initial value.
    if (loop->landingPad->globOptData.liveFields->Test(propertySym->m_id))
    {
        return;
    }

    StackSym * objectSym = propertySym->m_stackSym;
    Value *landingPadObjPtrVal, *currentObjPtrVal;
    landingPadObjPtrVal = loop->landingPad->globOptData.FindValue(objectSym);
    currentObjPtrVal = CurrentBlockData()->FindValue(objectSym);
    
    auto CanSetInitialValue = [&]() -> bool {
        if (!currentObjPtrVal)
        {
            return false;
        }
        if (landingPadObjPtrVal)
        {
            return currentObjPtrVal->GetValueNumber() == landingPadObjPtrVal->GetValueNumber();
        }
        else
        {
            if (!objectSym->IsSingleDef())
            {
                return false;
            }
            IR::Instr * defInstr = objectSym->GetInstrDef();
            IR::Opnd * src1 = defInstr->GetSrc1();
            while (!(src1 && src1->IsSymOpnd() && src1->AsSymOpnd()->m_sym->IsPropertySym()))
            {
                if (src1 && src1->IsRegOpnd() && src1->AsRegOpnd()->GetStackSym()->IsSingleDef())
                {
                    defInstr = src1->AsRegOpnd()->GetStackSym()->GetInstrDef();
                    src1 = defInstr->GetSrc1();
                }
                else
                {
                    return false;
                }
            }

            return true;

            // Todo: allow other kinds of operands as src1 of instr def of the object sym of the current propertySym
            // SymOpnd, but not PropertySymOpnd - LdSlotArr, some LdSlots (?)
            // nullptr - NewScObject
        }
    };

    if (!CanSetInitialValue())
    {
        // objPtr has a different value in the landing pad.
        return;
    }

    // The opnd's value type has not yet been initialized. Since the property sym doesn't have a value, it effectively has an
    // Uninitialized value type. Use the profiled value type from the instruction.
    const ValueType profiledValueType =
        instr->IsProfiledInstr() ? instr->AsProfiledInstr()->u.FldInfo().valueType : ValueType::Uninitialized;
    Assert(!profiledValueType.IsDefinite()); // Hence the values created here don't need to be tracked for kills
    initialValue = this->NewGenericValue(profiledValueType, propertySym);
    symStore = StackSym::New(this->func);

    initialValue->GetValueInfo()->SetSymStore(symStore);
    loop->initialValueFieldMap.Add(propertySym, initialValue->Copy(this->alloc, initialValue->GetValueNumber()));

    // Copy the initial value into the landing pad, but without a symStore
    Value *landingPadInitialValue = Value::New(this->alloc, initialValue->GetValueNumber(),
        ValueInfo::New(this->alloc, initialValue->GetValueInfo()->Type()));
    loop->landingPad->globOptData.SetValue(landingPadInitialValue, propertySym);
    loop->landingPad->globOptData.liveFields->Set(propertySym->m_id);

#if DBG_DUMP
    if (PHASE_TRACE(Js::FieldPREPhase, this->func))
    {
        Output::Print(_u("** TRACE:  Field PRE initial value for loop head #%d. Val:%d symStore:"),
            loop->GetHeadBlock()->GetBlockNum(), initialValue->GetValueNumber());
        symStore->Dump();
        Output::Print(_u("\n    Instr: "));
        instr->Dump();
        Output::Flush();
    }
#endif

    // Add initial value to all the previous blocks in the loop.
    FOREACH_BLOCK_BACKWARD_IN_RANGE(block, this->currentBlock->GetPrev(), loop->GetHeadBlock())
    {
        if (block->GetDataUseCount() == 0)
        {
            // All successor blocks have been processed, no point in adding the value.
            continue;
        }
        Value *newValue = initialValue->Copy(this->alloc, initialValue->GetValueNumber());
        block->globOptData.SetValue(newValue, propertySym);
        block->globOptData.liveFields->Set(propertySym->m_id);
        block->globOptData.SetValue(newValue, symStore);
        block->globOptData.liveVarSyms->Set(symStore->m_id);
    } NEXT_BLOCK_BACKWARD_IN_RANGE;

    CurrentBlockData()->SetValue(initialValue, symStore);
    CurrentBlockData()->liveVarSyms->Set(symStore->m_id);
    CurrentBlockData()->liveFields->Set(propertySym->m_id);
}